

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O1

void Handlers::StatSkill_Junk(Character *character,PacketReader *reader)

{
  PacketBuilder builder;
  PacketBuilder local_40;
  
  if (character->npc_type == Skills) {
    Character::Reset(character);
    PacketBuilder::PacketBuilder(&local_40,PACKET_STATSKILL,PACKET_JUNK,0x24);
    PacketBuilder::AddShort(&local_40,character->statpoints);
    PacketBuilder::AddShort(&local_40,character->skillpoints);
    PacketBuilder::AddShort(&local_40,character->hp);
    PacketBuilder::AddShort(&local_40,character->maxhp);
    PacketBuilder::AddShort(&local_40,character->tp);
    PacketBuilder::AddShort(&local_40,character->maxtp);
    PacketBuilder::AddShort(&local_40,character->maxsp);
    PacketBuilder::AddShort(&local_40,*character->display_str);
    PacketBuilder::AddShort(&local_40,*character->display_intl);
    PacketBuilder::AddShort(&local_40,*character->display_wis);
    PacketBuilder::AddShort(&local_40,*character->display_agi);
    PacketBuilder::AddShort(&local_40,*character->display_con);
    PacketBuilder::AddShort(&local_40,*character->display_cha);
    PacketBuilder::AddShort(&local_40,character->mindam);
    PacketBuilder::AddShort(&local_40,character->maxdam);
    PacketBuilder::AddShort(&local_40,character->accuracy);
    PacketBuilder::AddShort(&local_40,character->evade);
    PacketBuilder::AddShort(&local_40,character->armor);
    Character::Send(character,&local_40);
    PacketBuilder::~PacketBuilder(&local_40);
  }
  return;
}

Assistant:

void StatSkill_Junk(Character *character, PacketReader &reader)
{
	(void)reader;
	/*int shopid = reader.GetInt();*/

	if (character->npc_type == ENF::Skills)
	{
		character->Reset();

		PacketBuilder builder(PACKET_STATSKILL, PACKET_JUNK, 36);
		builder.AddShort(character->statpoints);
		builder.AddShort(character->skillpoints);
		builder.AddShort(character->hp);
		builder.AddShort(character->maxhp);
		builder.AddShort(character->tp);
		builder.AddShort(character->maxtp);
		builder.AddShort(character->maxsp);
		builder.AddShort(character->display_str);
		builder.AddShort(character->display_intl);
		builder.AddShort(character->display_wis);
		builder.AddShort(character->display_agi);
		builder.AddShort(character->display_con);
		builder.AddShort(character->display_cha);
		builder.AddShort(character->mindam);
		builder.AddShort(character->maxdam);
		builder.AddShort(character->accuracy);
		builder.AddShort(character->evade);
		builder.AddShort(character->armor);

		character->Send(builder);
	}
}